

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterator.h
# Opt level: O3

const_key_value_iterator __thiscall
QtPrivate::QKeyValueRange<const_QHash<QString,_QString>_&>::begin
          (QKeyValueRange<const_QHash<QString,_QString>_&> *this)

{
  ulong uVar1;
  Data *pDVar2;
  ulong uVar3;
  const_key_value_iterator cVar4;
  const_key_value_iterator cVar5;
  
  pDVar2 = ((this->super_QKeyValueRangeStorage<const_QHash<QString,_QString>_&>).m_map)->d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else if (pDVar2->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) {
        return (const_iterator)ZEXT816(0);
      }
      uVar1 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    cVar4.i.i.bucket = uVar3;
    cVar4.i.i.d = pDVar2;
    return (const_key_value_iterator)cVar4.i.i;
  }
  cVar5.i.i.bucket = 0;
  cVar5.i.i.d = pDVar2;
  return (const_key_value_iterator)cVar5.i.i;
}

Assistant:

Map &map() { return *m_map; }